

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_filename.c
# Opt level: O0

void test_read_format_cpio_filename_UTF8_eucJP(char *refname)

{
  wchar_t wVar1;
  char *pcVar2;
  archive *paVar3;
  char *in_RDI;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  archive_entry *ae;
  archive *a;
  wchar_t in_stack_00000028;
  archive *in_stack_ffffffffffffffd8;
  archive *paVar4;
  archive_entry *paVar5;
  archive_entry **ppaVar6;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar7;
  uint in_stack_ffffffffffffffe4;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  
  pcVar2 = setlocale(6,"ja_JP.eucJP");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'^');
    test_skipping("ja_JP.eucJP locale not available on this system.");
  }
  else {
    paVar3 = archive_read_new();
    assertion_assert((char *)paVar3,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
    archive_read_support_filter_all(in_stack_ffffffffffffffd8);
    paVar4 = paVar3;
    assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar3 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar3,(char *)0x173574,ae);
    archive_read_support_format_all(paVar3);
    paVar3 = paVar4;
    assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar4 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar4,(char *)0x1735ad,ae);
    wVar1 = archive_read_set_options
                      ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       (char *)paVar4);
    if (wVar1 == L'\0') {
      archive_read_open_filename
                (paVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      paVar4 = paVar3;
      assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar3 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (longlong)paVar3,(char *)0x17362d,ae);
      archive_read_next_header
                ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (archive_entry **)paVar3);
      assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar4 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (longlong)paVar4,(char *)0x17366b,ae);
      archive_entry_filetype
                ((archive_entry *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      paVar5 = (archive_entry *)0x0;
      assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar4 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                          (char *)0x1736a8,ae);
      archive_entry_pathname(paVar5);
      uVar7 = 0;
      assertion_equal_string
                (in_stack_00000008,unaff_retaddr,in_RDI,(char *)paVar4,
                 (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),refname,in_stack_00000028);
      archive_entry_size((archive_entry *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      ppaVar6 = (archive_entry **)0x0;
      assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar4 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar7),0,(char *)0x17372a,ae);
      archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar7),ppaVar6);
      assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar4 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar7),(longlong)paVar4,
                          (char *)0x173768,ae);
      archive_entry_filetype
                ((archive_entry *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      paVar5 = (archive_entry *)0x0;
      assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar4 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar7),0,(char *)0x1737a5,ae);
      archive_entry_pathname(paVar5);
      in_stack_ffffffffffffffe0 = 0;
      assertion_equal_string
                (in_stack_00000008,unaff_retaddr,in_RDI,(char *)paVar4,
                 (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),refname,in_stack_00000028);
      archive_entry_size((archive_entry *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      ppaVar6 = (archive_entry **)0x0;
      assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar4 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                          (char *)0x173827,ae);
      archive_read_next_header
                ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),ppaVar6);
      paVar3 = paVar4;
      assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar4 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (longlong)paVar4,(char *)0x173866,ae);
      archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (int)((ulong)paVar4 >> 0x20));
      assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar3 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (longlong)paVar3,(char *)0x1738a1,ae);
      archive_format(paVar3);
      assertion_equal_int(in_RDI,(wchar_t)((ulong)paVar3 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (longlong)paVar3,(char *)0x1738db,ae);
      wVar1 = (wchar_t)((ulong)paVar3 >> 0x20);
      archive_read_close((archive *)0x1738e5);
      assertion_equal_int(in_RDI,wVar1,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                          ,(char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                          (char *)0x173913,ae);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'e');
      wVar1 = (wchar_t)((ulong)paVar3 >> 0x20);
      test_skipping("This system cannot convert character-set from UTF-8 to eucJP.");
    }
    archive_read_free((archive *)0x17391d);
    assertion_equal_int(in_RDI,wVar1,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x17394b,ae);
  }
  return;
}

Assistant:

static void
test_read_format_cpio_filename_UTF8_eucJP(const char *refname)
{
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read UTF-8 filename in ja_JP.eucJP with "hdrcharset=UTF-8" option.
	 */
	if (NULL == setlocale(LC_ALL, "ja_JP.eucJP")) {
		skipping("ja_JP.eucJP locale not available on this system.");
		return;
	}
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=UTF-8")) {
		skipping("This system cannot convert character-set"
		    " from UTF-8 to eucJP.");
		goto cleanup;
	}

	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("\xb4\xc1\xbb\xfa.txt", archive_entry_pathname(ae));
	assertEqualInt(8, archive_entry_size(ae));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("\xc9\xbd.txt", archive_entry_pathname(ae));
	assertEqualInt(4, archive_entry_size(ae));


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_CPIO_POSIX, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}